

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_prtyd(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  TCGv_i64 ret;
  TCGv_i64 arg1;
  uint32_t uVar1;
  TCGv_i64 ret_00;
  TCGv_i64 t0;
  TCGv_i64 rs;
  TCGv_i64 ra;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  uVar1 = rA(ctx->opcode);
  ret = cpu_gpr[uVar1];
  uVar1 = rS(ctx->opcode);
  arg1 = cpu_gpr[uVar1];
  ret_00 = tcg_temp_new_i64(tcg_ctx_00);
  tcg_gen_shri_i64_ppc64(tcg_ctx_00,ret_00,arg1,0x20);
  tcg_gen_xor_i64_ppc64(tcg_ctx_00,ret,arg1,ret_00);
  tcg_gen_shri_i64_ppc64(tcg_ctx_00,ret_00,ret,0x10);
  tcg_gen_xor_i64_ppc64(tcg_ctx_00,ret,ret,ret_00);
  tcg_gen_shri_i64_ppc64(tcg_ctx_00,ret_00,ret,8);
  tcg_gen_xor_i64_ppc64(tcg_ctx_00,ret,ret,ret_00);
  tcg_gen_andi_i64_ppc64(tcg_ctx_00,ret,ret,1);
  tcg_temp_free_i64(tcg_ctx_00,ret_00);
  return;
}

Assistant:

static void gen_prtyd(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv ra = cpu_gpr[rA(ctx->opcode)];
    TCGv rs = cpu_gpr[rS(ctx->opcode)];
    TCGv t0 = tcg_temp_new(tcg_ctx);
    tcg_gen_shri_tl(tcg_ctx, t0, rs, 32);
    tcg_gen_xor_tl(tcg_ctx, ra, rs, t0);
    tcg_gen_shri_tl(tcg_ctx, t0, ra, 16);
    tcg_gen_xor_tl(tcg_ctx, ra, ra, t0);
    tcg_gen_shri_tl(tcg_ctx, t0, ra, 8);
    tcg_gen_xor_tl(tcg_ctx, ra, ra, t0);
    tcg_gen_andi_tl(tcg_ctx, ra, ra, 1);
    tcg_temp_free(tcg_ctx, t0);
}